

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall
FSingleLumpFont::FixupPalette
          (FSingleLumpFont *this,BYTE *identity,double *luminosity,BYTE *palette,bool rescale,
          PalEntry *out_palette)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  double dVar5;
  double lum;
  int b;
  int g;
  int r;
  double diver;
  double minlum;
  double maxlum;
  int i;
  PalEntry *out_palette_local;
  byte *pbStack_28;
  bool rescale_local;
  BYTE *palette_local;
  double *luminosity_local;
  BYTE *identity_local;
  FSingleLumpFont *this_local;
  
  minlum = 0.0;
  diver = 100000000.0;
  *identity = '\0';
  pbStack_28 = palette + 3;
  for (maxlum._4_4_ = 1; maxlum._4_4_ < (this->super_FFont).ActiveColors;
      maxlum._4_4_ = maxlum._4_4_ + 1) {
    bVar1 = *pbStack_28;
    bVar2 = pbStack_28[1];
    bVar3 = pbStack_28[2];
    dVar5 = (double)bVar1 * 0.299 + (double)bVar2 * 0.587 + (double)bVar3 * 0.114;
    BVar4 = FColorMatcher::Pick(&ColorMatcher,(uint)bVar1,(uint)bVar2,(uint)bVar3);
    identity[maxlum._4_4_] = BVar4;
    luminosity[maxlum._4_4_] = dVar5;
    out_palette[maxlum._4_4_].field_0.field_0.r = bVar1;
    out_palette[maxlum._4_4_].field_0.field_0.g = bVar2;
    out_palette[maxlum._4_4_].field_0.field_0.b = bVar3;
    out_palette[maxlum._4_4_].field_0.field_0.a = 0xff;
    if (minlum < dVar5) {
      minlum = dVar5;
    }
    if (dVar5 < diver) {
      diver = dVar5;
    }
    pbStack_28 = pbStack_28 + 3;
  }
  PalEntry::operator=(out_palette,0);
  if (rescale) {
    _g = 1.0 / (minlum - diver);
  }
  else {
    _g = 0.00392156862745098;
  }
  for (maxlum._4_4_ = 1; maxlum._4_4_ < (this->super_FFont).ActiveColors;
      maxlum._4_4_ = maxlum._4_4_ + 1) {
    luminosity[maxlum._4_4_] = (luminosity[maxlum._4_4_] - diver) * _g;
  }
  return;
}

Assistant:

void FSingleLumpFont::FixupPalette (BYTE *identity, double *luminosity, const BYTE *palette, bool rescale, PalEntry *out_palette)
{
	int i;
	double maxlum = 0.0;
	double minlum = 100000000.0;
	double diver;

	identity[0] = 0;
	palette += 3;	// Skip the transparent color

	for (i = 1; i < ActiveColors; ++i, palette += 3)
	{
		int r = palette[0];
		int g = palette[1];
		int b = palette[2];
		double lum = r*0.299 + g*0.587 + b*0.114;
		identity[i] = ColorMatcher.Pick (r, g, b);
		luminosity[i] = lum;
		out_palette[i].r = r;
		out_palette[i].g = g;
		out_palette[i].b = b;
		out_palette[i].a = 255;
		if (lum > maxlum)
			maxlum = lum;
		if (lum < minlum)
			minlum = lum;
	}
	out_palette[0] = 0;

	if (rescale)
	{
		diver = 1.0 / (maxlum - minlum);
	}
	else
	{
		diver = 1.0 / 255.0;
	}
	for (i = 1; i < ActiveColors; ++i)
	{
		luminosity[i] = (luminosity[i] - minlum) * diver;
	}
}